

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

int32 dict_read(FILE *fp,dict_t *d)

{
  char *line;
  dictword_t *pdVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  int32 extraout_EAX;
  char **ptr;
  lineiter_t *li;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint max_ptr;
  int iVar9;
  char *in_stack_ffffffffffffff98;
  undefined4 uVar10;
  s3cipid_t *local_50;
  long local_40;
  
  local_50 = (s3cipid_t *)
             __ckd_calloc__(0x204,2,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                            ,0x9d);
  ptr = (char **)__ckd_calloc__(0x200,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                ,0x9e);
  li = lineiter_start(fp);
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (li == (lineiter_t *)0x0) {
    uVar8 = 0;
    iVar4 = 0;
  }
  else {
    max_ptr = 0x200;
    iVar6 = 0;
    local_40 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + 1;
      line = li->buf;
      if (*line == ';') {
        if (line[1] != ';') goto LAB_00124661;
      }
      else if ((*line != '#') || (line[1] != '#')) {
LAB_00124661:
        uVar3 = str2words(line,ptr,max_ptr);
        if ((int)uVar3 < 0) {
          uVar3 = str2words(li->buf,(char **)0x0,0);
          if ((int)uVar3 <= (int)max_ptr) {
            __assert_fail("nwd > maxwd",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                          ,0xab,"int32 dict_read(FILE *, dict_t *)");
          }
          local_50 = (s3cipid_t *)
                     __ckd_realloc__(local_50,(ulong)uVar3 * 2 + 8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                     ,0xad);
          ptr = (char **)__ckd_realloc__(ptr,(ulong)uVar3 << 3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                         ,0xae);
          max_ptr = uVar3;
        }
        if (uVar3 != 0) {
          if (uVar3 == 1) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                    ,0xb6,"Line %d: No pronunciation for word \'%s\'; ignored\n",(ulong)uVar7,*ptr);
          }
          else {
            uVar8 = 1;
            if ((int)uVar3 < 2) {
LAB_0012478f:
              if ((uint)uVar8 != uVar3) goto LAB_0012480c;
            }
            else {
              uVar8 = 1;
              do {
                if (d->nocase == 0) {
                  iVar4 = bin_mdef_ciphone_id(d->mdef,ptr[uVar8]);
                  sVar2 = (short)iVar4;
                }
                else {
                  iVar4 = bin_mdef_ciphone_id_nocase(d->mdef,ptr[uVar8]);
                  sVar2 = (short)iVar4;
                }
                local_50[uVar8 - 1] = sVar2;
                if (sVar2 < 0) {
                  in_stack_ffffffffffffff98 = *ptr;
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                          ,0xc0,
                          "Line %d: Phone \'%s\' is missing in the acoustic model; word \'%s\' ignored\n"
                          ,(ulong)uVar7,ptr[uVar8],in_stack_ffffffffffffff98);
                  goto LAB_0012478f;
                }
                uVar8 = uVar8 + 1;
              } while (uVar3 != uVar8);
            }
            uVar3 = dict_add_word(d,*ptr,local_50,uVar3 - 1);
            if ((int)uVar3 < 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                      ,0xca,"Line %d: Failed to add the word \'%s\' (duplicate?); ignored\n",
                      (ulong)uVar7,*ptr);
            }
            else {
              pdVar1 = d->word;
              sVar5 = strlen(pdVar1[uVar3].word);
              local_40 = local_40 + sVar5;
              iVar6 = iVar6 + pdVar1[uVar3].pronlen * 2;
            }
          }
        }
      }
LAB_0012480c:
      li = lineiter_next(li);
      uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    } while (li != (lineiter_t *)0x0);
    iVar4 = (int)local_40;
    iVar9 = iVar4 + 0x3ff;
    if (-1 < iVar4) {
      iVar9 = iVar4;
    }
    uVar8 = (ulong)(uint)(iVar9 >> 10);
    iVar4 = iVar6 + 0x3ff;
    if (-1 < iVar6) {
      iVar4 = iVar6;
    }
    iVar4 = iVar4 >> 10;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
          0xd2,"Dictionary size %d, allocated %d KiB for strings, %d KiB for phones\n",
          (ulong)(uint)d->n_word,uVar8,CONCAT44(uVar10,iVar4));
  ckd_free(local_50);
  ckd_free(ptr);
  return extraout_EAX;
}

Assistant:

static int32
dict_read(FILE * fp, dict_t * d)
{
    lineiter_t *li;
    char **wptr;
    s3cipid_t *p;
    int32 lineno, nwd;
    s3wid_t w;
    int32 i, maxwd;
    size_t stralloc, phnalloc;

    maxwd = 512;
    p = (s3cipid_t *) ckd_calloc(maxwd + 4, sizeof(*p));
    wptr = (char **) ckd_calloc(maxwd, sizeof(char *)); /* Freed below */

    lineno = 0;
    stralloc = phnalloc = 0;
    for (li = lineiter_start(fp); li; li = lineiter_next(li)) {
        lineno++;
        if (0 == strncmp(li->buf, "##", 2)
            || 0 == strncmp(li->buf, ";;", 2))
            continue;

        if ((nwd = str2words(li->buf, wptr, maxwd)) < 0) {
            /* Increase size of p, wptr. */
            nwd = str2words(li->buf, NULL, 0);
            assert(nwd > maxwd); /* why else would it fail? */
            maxwd = nwd;
            p = (s3cipid_t *) ckd_realloc(p, (maxwd + 4) * sizeof(*p));
            wptr = (char **) ckd_realloc(wptr, maxwd * sizeof(*wptr));
        }

        if (nwd == 0)           /* Empty line */
            continue;
        /* wptr[0] is the word-string and wptr[1..nwd-1] the pronunciation sequence */
        if (nwd == 1) {
            E_ERROR("Line %d: No pronunciation for word '%s'; ignored\n",
                    lineno, wptr[0]);
            continue;
        }


        /* Convert pronunciation string to CI-phone-ids */
        for (i = 1; i < nwd; i++) {
            p[i - 1] = dict_ciphone_id(d, wptr[i]);
            if (NOT_S3CIPID(p[i - 1])) {
                E_ERROR("Line %d: Phone '%s' is missing in the acoustic model; word '%s' ignored\n",
                        lineno, wptr[i], wptr[0]);
                break;
            }
        }

        if (i == nwd) {         /* All CI-phones successfully converted to IDs */
            w = dict_add_word(d, wptr[0], p, nwd - 1);
            if (NOT_S3WID(w))
                E_ERROR
                    ("Line %d: Failed to add the word '%s' (duplicate?); ignored\n",
                     lineno, wptr[0]);
            else {
                stralloc += strlen(d->word[w].word);
                phnalloc += d->word[w].pronlen * sizeof(s3cipid_t);
            }
        }
    }
    E_INFO("Dictionary size %d, allocated %d KiB for strings, %d KiB for phones\n",
           dict_size(d), (int)stralloc / 1024, (int)phnalloc / 1024);
    ckd_free(p);
    ckd_free(wptr);

    return 0;
}